

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::Resolution>::~Vector(Vector<capnp::compiler::Resolution> *this)

{
  Resolution *pRVar1;
  RemoveConst<capnp::compiler::Resolution> *pRVar2;
  Resolution *pRVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = (this->builder).ptr;
  if (pRVar1 != (Resolution *)0x0) {
    pRVar2 = (this->builder).pos;
    pRVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Resolution *)0x0;
    (this->builder).pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
    (this->builder).endPtr = (Resolution *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pRVar1,0x20,(long)pRVar2 - (long)pRVar1 >> 5,(long)pRVar3 - (long)pRVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::compiler::Resolution>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }